

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall QWidgetLineControl::internalInsert(QWidgetLineControl *this,QString *s)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QString *pQVar5;
  QObject *obj;
  qsizetype qVar6;
  QString *s_00;
  long lVar7;
  QString *this_00;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int remaining;
  int i;
  QString ms;
  int delay;
  QAccessibleTextInsertEvent insertEvent_1;
  QAccessibleTextCursorEvent event;
  QAccessibleTextInsertEvent insertEvent;
  int in_stack_fffffffffffffe28;
  CommandType in_stack_fffffffffffffe2c;
  CommandType t;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int iVar8;
  Duration in_stack_fffffffffffffe38;
  QWidgetLineControl *in_stack_fffffffffffffe40;
  QObject *in_stack_fffffffffffffe48;
  Command *in_stack_fffffffffffffe50;
  QWidgetLineControl *in_stack_fffffffffffffe58;
  int local_178;
  int local_16c;
  undefined1 in_stack_fffffffffffffeb7;
  QString *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec4;
  QWidgetLineControl *in_stack_fffffffffffffec8;
  QString local_f8;
  QChar local_da [9];
  rep local_c8;
  rep local_c0;
  int local_ac;
  QAccessibleTextInsertEvent local_a8 [64];
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QAccessibleTextInsertEvent local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)(in_RDI + 0x50) >> 4 & 3) == 2) {
    bVar1 = QBasicTimer::isActive((QBasicTimer *)(in_RDI + 0x124));
    if (bVar1) {
      QBasicTimer::stop();
    }
    local_ac = *(int *)(in_RDI + 0x128);
    if (0 < local_ac) {
      local_c8 = (rep)ms<(char)49>();
      local_c0 = (rep)std::chrono::operator*
                                ((int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ),(duration<long,_std::ratio<1L,_1000L>_> *)0x5dbb4e
                                );
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::
      duration<long,std::ratio<1l,1000l>,void>
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (duration<long,_std::ratio<1L,_1000L>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      QBasicTimer::start((QBasicTimer *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                         in_stack_fffffffffffffe38,(QObject *)0x5dbb82);
    }
  }
  bVar1 = hasSelectedText((QWidgetLineControl *)
                          CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  if (bVar1) {
    QChar::QChar<char16_t,_true>(local_da,L'\0');
    Command::Command((Command *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffe38.__r >> 0x30),0,0x5dbbe0);
    addCommand(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)0x5dbc03);
  if (bVar1) {
    local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    maskString(in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8,
               (bool)in_stack_fffffffffffffeb7);
    bVar1 = QString::isEmpty((QString *)0x5dbc63);
    if ((bVar1) && (bVar1 = QString::isEmpty((QString *)0x5dbc73), !bVar1)) {
      inputRejected((QWidgetLineControl *)0x5dbc81);
    }
    memset(local_48,0xaa,0x40);
    accessibleObject((QWidgetLineControl *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
              ((QAccessibleTextInsertEvent *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
               (QString *)in_stack_fffffffffffffe38.__r);
    QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
    for (local_16c = 0; qVar6 = QString::size(&local_f8), local_16c < (int)qVar6;
        local_16c = local_16c + 1) {
      QString::at((QString *)in_stack_fffffffffffffe38.__r,
                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Command::Command((Command *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffe38.__r >> 0x30),0,0x5dbd4a);
      addCommand(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      QString::at((QString *)in_stack_fffffffffffffe38.__r,
                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      Command::Command((Command *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffe38.__r >> 0x30),0,0x5dbda7);
      addCommand(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    }
    lVar7 = in_RDI + 0x18;
    lVar4 = (long)*(int *)(in_RDI + 0x40);
    pQVar5 = (QString *)QString::size(&local_f8);
    QString::replace(lVar7,lVar4,pQVar5);
    qVar6 = QString::size(&local_f8);
    *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + (int)qVar6;
    iVar2 = nextMaskBlank(in_stack_fffffffffffffe40,
                          (int)((ulong)in_stack_fffffffffffffe38.__r >> 0x20));
    *(int *)(in_RDI + 0x40) = iVar2;
    *(ushort *)(in_RDI + 0x50) = *(ushort *)(in_RDI + 0x50) & 0xffbf | 0x40;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    accessibleObject((QWidgetLineControl *)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    QAccessibleTextCursorEvent::QAccessibleTextCursorEvent
              ((QAccessibleTextCursorEvent *)in_stack_fffffffffffffe40,
               (QObject *)in_stack_fffffffffffffe38.__r,in_stack_fffffffffffffe34);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_68);
    QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)&local_68)
    ;
    QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent(local_48);
    QString::~QString((QString *)0x5dbed6);
  }
  else {
    obj = (QObject *)(long)*(int *)(in_RDI + 0x60);
    qVar6 = QString::size((QString *)(in_RDI + 0x18));
    iVar8 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
    iVar2 = (int)obj - (int)qVar6;
    if (iVar2 != 0) {
      memset(local_a8,0xaa,0x40);
      accessibleObject((QWidgetLineControl *)
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
                ((QAccessibleTextInsertEvent *)in_stack_fffffffffffffe50,obj,iVar8,
                 (QString *)in_stack_fffffffffffffe38.__r);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_a8);
      this_00 = (QString *)(in_RDI + 0x18);
      s_00 = (QString *)(long)*(int *)(in_RDI + 0x40);
      QString::left((QString *)obj,(qsizetype)s_00);
      QString::insert((QString *)in_stack_fffffffffffffe50,(qsizetype)obj,s_00);
      QString::~QString((QString *)0x5dbfac);
      local_178 = 0;
      while( true ) {
        iVar8 = local_178;
        QString::left((QString *)obj,(qsizetype)s_00);
        qVar6 = QString::size((QString *)&stack0xfffffffffffffeb8);
        iVar3 = (int)qVar6;
        QString::~QString((QString *)0x5dbff1);
        if (iVar3 <= iVar8) break;
        t = *(CommandType *)(in_RDI + 0x40);
        *(CommandType *)(in_RDI + 0x40) = t + Insert;
        QString::at(this_00,CONCAT44(iVar8,iVar3));
        Command::Command((Command *)CONCAT44(iVar8,iVar3),t,in_stack_fffffffffffffe28,
                         (QChar)(char16_t)((ulong)this_00 >> 0x30),0,0x5dc047);
        addCommand(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        local_178 = local_178 + 1;
      }
      *(ushort *)(in_RDI + 0x50) = *(ushort *)(in_RDI + 0x50) & 0xffbf | 0x40;
      QAccessibleTextInsertEvent::~QAccessibleTextInsertEvent(local_a8);
    }
    qVar6 = QString::size(in_RSI);
    if (iVar2 < qVar6) {
      inputRejected((QWidgetLineControl *)0x5dc0a9);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::internalInsert(const QString &s)
{
    if (m_echoMode == QLineEdit::Password) {
        if (m_passwordEchoTimer.isActive())
            m_passwordEchoTimer.stop();
        int delay = m_passwordMaskDelay;
#ifdef QT_BUILD_INTERNAL
        if (m_passwordMaskDelayOverride >= 0)
            delay = m_passwordMaskDelayOverride;
#endif

        if (delay > 0)
            m_passwordEchoTimer.start(delay * 1ms, this);
    }
    if (hasSelectedText())
        addCommand(Command(SetSelection, m_cursor, u'\0', m_selstart, m_selend));
    if (m_maskData) {
        QString ms = maskString(m_cursor, s);
        if (ms.isEmpty() && !s.isEmpty())
            emit inputRejected();
#if QT_CONFIG(accessibility)
        QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, ms);
        QAccessible::updateAccessibility(&insertEvent);
#endif
        for (int i = 0; i < (int) ms.size(); ++i) {
            addCommand (Command(DeleteSelection, m_cursor + i, m_text.at(m_cursor + i), -1, -1));
            addCommand(Command(Insert, m_cursor + i, ms.at(i), -1, -1));
        }
        m_text.replace(m_cursor, ms.size(), ms);
        m_cursor += ms.size();
        m_cursor = nextMaskBlank(m_cursor);
        m_textDirty = true;
#if QT_CONFIG(accessibility)
        QAccessibleTextCursorEvent event(accessibleObject(), m_cursor);
        QAccessible::updateAccessibility(&event);
#endif
    } else {
        int remaining = m_maxLength - m_text.size();
        if (remaining != 0) {
#if QT_CONFIG(accessibility)
            QAccessibleTextInsertEvent insertEvent(accessibleObject(), m_cursor, s);
            QAccessible::updateAccessibility(&insertEvent);
#endif
            m_text.insert(m_cursor, s.left(remaining));
            for (int i = 0; i < (int) s.left(remaining).size(); ++i)
               addCommand(Command(Insert, m_cursor++, s.at(i), -1, -1));
            m_textDirty = true;
        }
        if (s.size() > remaining)
            emit inputRejected();
    }
}